

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

int av1_get_eob_pos_token(int eob,int *extra)

{
  char cVar1;
  int local_1c;
  int e;
  int t;
  int *extra_local;
  int eob_local;
  
  if (eob < 0x21) {
    cVar1 = ""[eob];
  }
  else {
    if (eob + -1 >> 5 < 0x10) {
      local_1c = eob + -1 >> 5;
    }
    else {
      local_1c = 0x10;
    }
    cVar1 = "\x06\a\b\b\t\t\t\t\n\n\n\n\n\n\n\n\v"[local_1c];
  }
  t = (int)cVar1;
  *extra = eob - av1_eob_group_start[t];
  return t;
}

Assistant:

int av1_get_eob_pos_token(const int eob, int *const extra) {
  int t;

  if (eob < 33) {
    t = eob_to_pos_small[eob];
  } else {
    const int e = AOMMIN((eob - 1) >> 5, 16);
    t = eob_to_pos_large[e];
  }

  *extra = eob - av1_eob_group_start[t];

  return t;
}